

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isPossibleStatement(TokenKind kind)

{
  uint uVar1;
  undefined6 in_register_0000003a;
  
  uVar1 = (uint)CONCAT62(in_register_0000003a,kind);
  if ((((((0x34 < uVar1 - 0x57) || ((0x1446007084e001U >> ((ulong)(uVar1 - 0x57) & 0x3f) & 1) == 0))
        && ((0x2f < uVar1 || ((0xc0d0800a300cU >> ((ulong)kind & 0x3f) & 1) == 0)))) &&
       ((0x3c < uVar1 - 0xee || ((0x1010000001e06001U >> ((ulong)(uVar1 - 0xee) & 0x3f) & 1) == 0)))
       ) && ((0x1e < uVar1 - 0x138 || ((0x6021c019U >> (uVar1 - 0x138 & 0x1f) & 1) == 0)))) &&
     ((0x12 < uVar1 - 0xa4 || ((0x407c1U >> (uVar1 - 0xa4 & 0x1f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPossibleStatement(TokenKind kind) {
    switch (kind) {
        case TokenKind::Identifier:
        case TokenKind::SystemIdentifier:
        case TokenKind::ThisKeyword:
        case TokenKind::SuperKeyword:
        case TokenKind::UnitSystemName:
        case TokenKind::RootSystemName:
        case TokenKind::OpenBrace:
        case TokenKind::ApostropheOpenBrace:
        case TokenKind::AssignKeyword:
        case TokenKind::DeassignKeyword:
        case TokenKind::ForceKeyword:
        case TokenKind::ReleaseKeyword:
        case TokenKind::UniqueKeyword:
        case TokenKind::Unique0Keyword:
        case TokenKind::PriorityKeyword:
        case TokenKind::CaseKeyword:
        case TokenKind::CaseXKeyword:
        case TokenKind::CaseZKeyword:
        case TokenKind::IfKeyword:
        case TokenKind::DoublePlus:
        case TokenKind::DoubleMinus:
        case TokenKind::VoidKeyword:
        case TokenKind::TypeKeyword:
        case TokenKind::DisableKeyword:
        case TokenKind::MinusArrow:
        case TokenKind::MinusDoubleArrow:
        case TokenKind::ForeverKeyword:
        case TokenKind::RepeatKeyword:
        case TokenKind::WhileKeyword:
        case TokenKind::ForKeyword:
        case TokenKind::DoKeyword:
        case TokenKind::ForeachKeyword:
        case TokenKind::ReturnKeyword:
        case TokenKind::BreakKeyword:
        case TokenKind::ContinueKeyword:
        case TokenKind::ForkKeyword:
        case TokenKind::Hash:
        case TokenKind::DoubleHash:
        case TokenKind::At:
        case TokenKind::BeginKeyword:
        case TokenKind::WaitKeyword:
        case TokenKind::WaitOrderKeyword:
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword:
        case TokenKind::RestrictKeyword:
        case TokenKind::RandSequenceKeyword:
        case TokenKind::RandCaseKeyword:
        case TokenKind::ExpectKeyword:
        case TokenKind::OpenParenthesis:
        case TokenKind::Semicolon:
            return true;
        default:
            return false;
    }
}